

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
google::protobuf::internal::GenerateEnumData
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Span<const_int> values)

{
  pointer *ppuVar1;
  pointer *this;
  Nullable<const_char_*> ptr;
  int iVar2;
  bool bVar3;
  ushort uVar4;
  uint32_t bit;
  iterator piVar5;
  short *psVar6;
  ulong uVar7;
  size_type sVar8;
  char *pcVar9;
  LogMessage *pLVar10;
  size_type sVar11;
  reference piVar12;
  reference __result;
  EytzingerLayoutSorter local_278;
  uint *local_250;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_248;
  LogMessage local_240;
  Voidify local_22b;
  unsigned_short local_22a;
  unsigned_long local_228;
  Nullable<const_char_*> local_220;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_203;
  unsigned_short local_202;
  unsigned_long local_200;
  Nullable<const_char_*> local_1f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_1e8;
  Voidify local_1d7;
  unsigned_short local_1d6;
  uint local_1d4;
  Nullable<const_char_*> local_1d0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t *p;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> fallback_values;
  iterator iStack_178;
  int32_t to_collapse;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  Voidify local_149;
  unsigned_long local_148;
  unsigned_long local_140;
  Nullable<const_char_*> local_138;
  Nullable<const_char_*> absl_log_internal_check_op_result_4;
  size_t cost_if_collapse;
  size_t rounded_bitmap_size;
  size_t cost_if_fallback;
  Voidify local_105;
  int local_104;
  unsigned_long local_100;
  Nullable<const_char_*> local_f8;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  anon_class_8_1_f2b22452 add_bit;
  undefined1 auStack_e0 [4];
  uint32_t adjusted;
  anon_class_16_2_ef8d1931 adjust;
  int32_t v;
  iterator __end2;
  iterator __begin2;
  Span<const_int> *__range2;
  uint32_t sequence_length;
  optional<short> start_sequence;
  size_t kBitmapBlockSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmap_values;
  vector<int,_std::allocator<int>_> fallback_values_after_bitmap;
  vector<int,_std::allocator<int>_> fallback_values_too_large;
  LogMessage local_40;
  Voidify local_29;
  anon_class_8_1_70098e60 local_28;
  anon_class_8_1_70098e60 sorted_and_unique;
  Span<const_int> values_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *output;
  
  sorted_and_unique.values = (Span<const_int> *)values.ptr_;
  local_28.values = (Span<const_int> *)&sorted_and_unique;
  bVar3 = GenerateEnumData::anon_class_8_1_70098e60::operator()(&local_28);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,0x6a,"sorted_and_unique()");
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  _sequence_length = 0x20;
  std::optional<short>::optional((optional<short> *)((long)&__range2 + 4));
  __range2._0_4_ = 0;
  __end2 = absl::lts_20250127::Span<const_int>::begin((Span<const_int> *)&sorted_and_unique);
  piVar5 = absl::lts_20250127::Span<const_int>::end((Span<const_int> *)&sorted_and_unique);
  for (; __end2 != piVar5; __end2 = __end2 + 1) {
    adjust.sequence_length._4_4_ = *__end2;
    bVar3 = std::optional<short>::has_value((optional<short> *)((long)&__range2 + 4));
    iVar2 = adjust.sequence_length._4_4_;
    if (bVar3) {
      psVar6 = std::optional<short>::operator*((optional<short> *)((long)&__range2 + 4));
      if ((iVar2 == (int)*psVar6 + (uint)__range2) && ((uint)__range2 < 0xffff)) {
        __range2._0_4_ = (uint)__range2 + 1;
      }
      else {
        _auStack_e0 = (optional<short> *)((long)&__range2 + 4);
        adjust.start_sequence = (optional<short> *)&__range2;
        add_bit.bitmap_values._4_4_ =
             GenerateEnumData::anon_class_16_2_ef8d1931::operator()
                       ((anon_class_16_2_ef8d1931 *)auStack_e0,adjust.sequence_length._4_4_);
        absl_log_internal_check_op_result_3 = (Nullable<const_char_*>)&kBitmapBlockSize;
        uVar7 = (ulong)add_bit.bitmap_values._4_4_;
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize)
        ;
        if (uVar7 < sVar8 << 5) {
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &bitmap_values.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_100 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar8);
          local_104 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
          local_f8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,int>
                               (&local_100,&local_104,"fallback_values_after_bitmap.size() == 0");
          if (local_f8 != (Nullable<const_char_*>)0x0) {
            pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_f8);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&cost_if_fallback,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                       ,0x98,pcVar9);
            pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&cost_if_fallback);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_105,pLVar10);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&cost_if_fallback);
          }
          GenerateEnumData::anon_class_8_1_f2b22452::operator()
                    ((anon_class_8_1_f2b22452 *)&absl_log_internal_check_op_result_3,
                     add_bit.bitmap_values._4_4_);
        }
        else {
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &kBitmapBlockSize);
          sVar11 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)
                              &bitmap_values.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          rounded_bitmap_size = sVar8 + sVar11 + 1;
          absl_log_internal_check_op_result_4 =
               (Nullable<const_char_*>)((ulong)add_bit.bitmap_values._4_4_ + 0x20 >> 5);
          cost_if_collapse = (size_t)absl_log_internal_check_op_result_4;
          if ((rounded_bitmap_size < absl_log_internal_check_op_result_4) ||
             (0xffff < (ulong)((long)absl_log_internal_check_op_result_4 << 5))) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (value_type_conflict1 *)((long)&adjust.sequence_length + 4));
          }
          else {
            local_140 = absl::lts_20250127::log_internal::GetReferenceableValue
                                  ((unsigned_long)absl_log_internal_check_op_result_4);
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &kBitmapBlockSize);
            local_148 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar8);
            local_138 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_long,unsigned_long>
                                  (&local_140,&local_148,
                                   "rounded_bitmap_size > bitmap_values.size()");
            if (local_138 != (Nullable<const_char_*>)0x0) {
              pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_138);
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&__range4,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                         ,0xa9,pcVar9);
              pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)&__range4);
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_149,pLVar10);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&__range4);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize,
                       cost_if_collapse);
            ppuVar1 = &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end4 = std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)ppuVar1);
            iStack_178 = std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)ppuVar1);
            while (bVar3 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffe88), bVar3) {
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end4);
              fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar12;
              bit = GenerateEnumData::anon_class_16_2_ef8d1931::operator()
                              ((anon_class_16_2_ef8d1931 *)auStack_e0,
                               fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage._4_4_);
              GenerateEnumData::anon_class_8_1_f2b22452::operator()
                        ((anon_class_8_1_f2b22452 *)&absl_log_internal_check_op_result_3,bit);
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end4);
            }
            std::vector<int,_std::allocator<int>_>::clear
                      ((vector<int,_std::allocator<int>_> *)
                       &bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            GenerateEnumData::anon_class_8_1_f2b22452::operator()
                      ((anon_class_8_1_f2b22452 *)&absl_log_internal_check_op_result_3,
                       add_bit.bitmap_values._4_4_);
          }
        }
      }
    }
    else if ((short)adjust.sequence_length._4_4_ == adjust.sequence_length._4_4_) {
      std::optional<short>::operator=
                ((optional<short> *)((long)&__range2 + 4),(int *)((long)&adjust.sequence_length + 4)
                );
      __range2._0_4_ = 1;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict1 *)((long)&adjust.sequence_length + 4));
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_198);
  bVar3 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_198,
               (vector<int,_std::allocator<int>_> *)
               &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    bVar3 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_198,
                 (vector<int,_std::allocator<int>_> *)
                 &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar11 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)
                          &bitmap_values.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_198,sVar8 + sVar11);
      this = &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      local_1a0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)this);
      local_1a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)this);
      ppuVar1 = &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)ppuVar1);
      local_1b8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)ppuVar1);
      __result = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_198,0);
      std::
      merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
                (local_1a0,local_1a8,local_1b0,local_1b8,__result);
    }
  }
  p._7_1_ = 0;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_198);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&p + 6));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,sVar8 + 2 + sVar11,(allocator<unsigned_int> *)((long)&p + 6));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&p + 6));
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(__return_storage_ptr__);
  local_1d4 = absl::lts_20250127::log_internal::GetReferenceableValue((uint)__range2);
  local_1d6 = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_short)__range2);
  local_1d0 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_short>
                        (&local_1d4,&local_1d6,
                         "sequence_length == static_cast<uint16_t>(sequence_length)");
  if (local_1d0 != (Nullable<const_char_*>)0x0) {
    pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_1d0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,200,pcVar9);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1e8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d7,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1e8);
  }
  absl_log_internal_check_op_result_1._4_4_ = 0;
  uVar4 = std::optional<short>::value_or<int>
                    ((optional<short> *)((long)&__range2 + 4),
                     (int *)((long)&absl_log_internal_check_op_result_1 + 4));
  *(uint *)absl_log_internal_check_op_result = (uint)uVar4 | (uint)__range2 << 0x10;
  absl_log_internal_check_op_result = absl_log_internal_check_op_result + 4;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  local_200 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar8 << 5);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  local_202 = absl::lts_20250127::log_internal::GetReferenceableValue
                        ((unsigned_short)((int)sVar8 << 5));
  local_1f8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_short>
                        (&local_200,&local_202,
                         "kBitmapBlockSize * bitmap_values.size() == static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size())"
                        );
  if (local_1f8 != (Nullable<const_char_*>)0x0) {
    pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_1f8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,0xcd,pcVar9);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                        ((LogMessage *)&absl_log_internal_check_op_result_2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_203,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
  }
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_198);
  local_228 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar8);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_198);
  local_22a = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_short)sVar8);
  local_220 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_short>
                        (&local_228,&local_22a,
                         "fallback_values.size() == static_cast<uint16_t>(fallback_values.size())");
  if (local_220 != (Nullable<const_char_*>)0x0) {
    pcVar9 = absl::lts_20250127::implicit_cast<char_const*>(local_220);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,0xcf,pcVar9);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_240);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_22b,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_240);
  }
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_198);
  *(int *)absl_log_internal_check_op_result = (int)sVar8 << 5 | (int)sVar11 << 0x10;
  absl_log_internal_check_op_result = absl_log_internal_check_op_result + 4;
  local_248._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  local_250 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &kBitmapBlockSize);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       std::
       copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                 (local_248,
                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   )local_250,(uint *)absl_log_internal_check_op_result);
  absl::lts_20250127::Span<int_const>::
  Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>,int>
            ((Span<int_const> *)&local_278,(vector<int,_std::allocator<int>_> *)local_198);
  ptr = absl_log_internal_check_op_result;
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_198);
  local_278.output = absl::lts_20250127::MakeSpan<unsigned_int>((Nullable<unsigned_int_*>)ptr,sVar8)
  ;
  local_278.i = 0;
  EytzingerLayoutSorter::Sort(&local_278,0);
  p._7_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_198);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&kBitmapBlockSize);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GenerateEnumData(absl::Span<const int32_t> values) {
  const auto sorted_and_unique = [&] {
    for (size_t i = 0; i + 1 < values.size(); ++i) {
      if (values[i] >= values[i + 1]) return false;
    }
    return true;
  };
  ABSL_DCHECK(sorted_and_unique());
  std::vector<int32_t> fallback_values_too_large, fallback_values_after_bitmap;
  std::vector<uint32_t> bitmap_values;
  constexpr size_t kBitmapBlockSize = 32;
  absl::optional<int16_t> start_sequence;
  uint32_t sequence_length = 0;
  for (int32_t v : values) {
    // If we don't yet have a sequence, start it.
    if (!start_sequence.has_value()) {
      // But only if we can fit it in the sequence.
      if (static_cast<int16_t>(v) != v) {
        fallback_values_too_large.push_back(v);
        continue;
      }

      start_sequence = v;
      sequence_length = 1;
      continue;
    }
    // If we can extend the sequence, do so.
    if (v == static_cast<int32_t>(*start_sequence) +
                 static_cast<int32_t>(sequence_length) &&
        sequence_length < 0xFFFF) {
      ++sequence_length;
      continue;
    }

    // We adjust the bitmap values to be relative to the end of the sequence.
    const auto adjust = [&](int32_t v) -> uint32_t {
      // Cast to int64_t first to avoid overflow. The result is guaranteed to be
      // positive and fit in uint32_t.
      int64_t a = static_cast<int64_t>(v) - *start_sequence - sequence_length;
      ABSL_DCHECK(a >= 0);
      ABSL_DCHECK_EQ(a, static_cast<uint32_t>(a));
      return a;
    };
    const uint32_t adjusted = adjust(v);

    const auto add_bit = [&](uint32_t bit) {
      bitmap_values[bit / kBitmapBlockSize] |= uint32_t{1}
                                               << (bit % kBitmapBlockSize);
    };

    // If we can fit it on the already allocated bitmap, do so.
    if (adjusted < kBitmapBlockSize * bitmap_values.size()) {
      // We can fit it in the existing bitmap.
      ABSL_DCHECK_EQ(fallback_values_after_bitmap.size(), 0);
      add_bit(adjusted);
      continue;
    }

    // We can't fit in the sequence and we can't fit in the current bitmap.
    // Evaluate if it is better to add to fallback, or to collapse all the
    // fallback values after the bitmap into the bitmap.
    const size_t cost_if_fallback =
        bitmap_values.size() + (1 + fallback_values_after_bitmap.size());
    const size_t rounded_bitmap_size =
        (adjusted + kBitmapBlockSize) / kBitmapBlockSize;
    const size_t cost_if_collapse = rounded_bitmap_size;

    if (cost_if_collapse <= cost_if_fallback &&
        kBitmapBlockSize * rounded_bitmap_size < 0x10000) {
      // Collapse the existing values, and add the new one.
      ABSL_DCHECK_GT(rounded_bitmap_size, bitmap_values.size());
      bitmap_values.resize(rounded_bitmap_size);
      for (int32_t to_collapse : fallback_values_after_bitmap) {
        add_bit(adjust(to_collapse));
      }
      fallback_values_after_bitmap.clear();
      add_bit(adjusted);
    } else {
      fallback_values_after_bitmap.push_back(v);
    }
  }

  std::vector<int32_t> fallback_values;
  if (fallback_values_after_bitmap.empty()) {
    fallback_values = std::move(fallback_values_too_large);
  } else if (fallback_values_too_large.empty()) {
    fallback_values = std::move(fallback_values_after_bitmap);
  } else {
    fallback_values.resize(fallback_values_too_large.size() +
                           fallback_values_after_bitmap.size());
    std::merge(fallback_values_too_large.begin(),
               fallback_values_too_large.end(),
               fallback_values_after_bitmap.begin(),
               fallback_values_after_bitmap.end(), &fallback_values[0]);
  }

  std::vector<uint32_t> output(
      2 /* seq start + seq len + bitmap len + ordered len */ +
      bitmap_values.size() + fallback_values.size());
  uint32_t* p = output.data();

  ABSL_DCHECK_EQ(sequence_length, static_cast<uint16_t>(sequence_length));
  *p++ = uint32_t{static_cast<uint16_t>(start_sequence.value_or(0))} |
         (uint32_t{sequence_length} << 16);
  ABSL_DCHECK_EQ(
      kBitmapBlockSize * bitmap_values.size(),
      static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size()));
  ABSL_DCHECK_EQ(fallback_values.size(),
                 static_cast<uint16_t>(fallback_values.size()));
  *p++ = static_cast<uint32_t>(kBitmapBlockSize * bitmap_values.size()) |
         static_cast<uint32_t>(fallback_values.size() << 16);
  p = std::copy(bitmap_values.begin(), bitmap_values.end(), p);

  EytzingerLayoutSorter{fallback_values,
                        absl::MakeSpan(p, fallback_values.size())}
      .Sort();

  return output;
}